

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandUndo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  if ((argc != 2) || (iVar1 = strcmp(argv[1],"-h"), iVar1 != 0)) {
    if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
      fprintf((FILE *)pAbc->Out,"Empty network.\n");
      return 0;
    }
    if (argc == 1) {
      iVar1 = CmdCommandRecall(pAbc,1,argv);
      return iVar1;
    }
  }
  fprintf((FILE *)pAbc->Err,"usage: undo\n");
  fprintf((FILE *)pAbc->Err,"         sets the current network to be the previously saved network\n"
         );
  return 1;
}

Assistant:

int CmdCommandUndo( Abc_Frame_t * pAbc, int argc, char **argv )
{
    if ( argc == 2 && !strcmp(argv[1], "-h") )
        goto usage;

    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }

    // if there are no arguments on the command line
    // set the current network to be the network from the previous step
    if ( argc == 1 )
        return CmdCommandRecall( pAbc, argc, argv );

usage:
    fprintf( pAbc->Err, "usage: undo\n" );
    fprintf( pAbc->Err, "         sets the current network to be the previously saved network\n" );
    return 1;

}